

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O1

char * cubeb_strings_intern(cubeb_strings *strings,char *s)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char **ppcVar6;
  char *pcVar7;
  long lVar8;
  
  if (s != (char *)0x0 && strings != (cubeb_strings *)0x0) {
    ppcVar6 = strings->data;
    uVar1 = strings->count;
    if ((ulong)uVar1 != 0) {
      lVar8 = 0;
      do {
        pcVar7 = *(char **)((long)ppcVar6 + lVar8);
        if ((pcVar7 != (char *)0x0) && (iVar5 = strcmp(pcVar7,s), iVar5 == 0)) goto LAB_001138d1;
        lVar8 = lVar8 + 8;
      } while ((ulong)uVar1 * 8 - lVar8 != 0);
    }
    pcVar7 = (char *)0x0;
LAB_001138d1:
    if (pcVar7 != (char *)0x0) {
      return pcVar7;
    }
    uVar2 = strings->size;
    if (uVar1 != uVar2) {
LAB_0011393c:
      pcVar7 = strdup(s);
      uVar1 = strings->count;
      strings->count = uVar1 + 1;
      strings->data[uVar1] = pcVar7;
      return pcVar7;
    }
    if (0xe0000000 < uVar2 * 2 + 0xe0000000) {
      if (strings->small_store == ppcVar6) {
        ppcVar6 = (char **)malloc((ulong)(uVar2 << 4));
        if (ppcVar6 == (char **)0x0) {
          ppcVar6 = (char **)0x0;
        }
        else {
          pcVar7 = strings->small_store[0];
          pcVar3 = strings->small_store[1];
          pcVar4 = strings->small_store[3];
          ppcVar6[2] = strings->small_store[2];
          ppcVar6[3] = pcVar4;
          *ppcVar6 = pcVar7;
          ppcVar6[1] = pcVar3;
        }
      }
      else {
        ppcVar6 = (char **)realloc(ppcVar6,(ulong)(uVar2 << 4));
      }
      if (ppcVar6 != (char **)0x0) {
        strings->size = uVar2 * 2;
        strings->data = ppcVar6;
        goto LAB_0011393c;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char const *
cubeb_strings_intern(cubeb_strings * strings, char const * s)
{
  char const * is = NULL;

  if (!strings || !s) {
    return NULL;
  }

  is = cubeb_strings_lookup(strings, s);
  if (is) {
    return is;
  }

  return cubeb_strings_push(strings, s);
}